

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::InlineCallApplyTarget_Shared
          (Inline *this,Instr *callInstr,bool originalCallTargetOpndIsJITOpt,
          StackSym *originalCallTargetStackSym,FunctionJITTimeInfo *inlineeData,
          uint inlineCacheIndex,bool safeThis,bool isApplyTarget,
          CallApplyTargetSourceType targetType,Instr *inlineeDefInstr,uint recursiveInlineDepth,
          Instr *funcObjCheckInsertInstr)

{
  TSize TVar1;
  Func *parentFunc;
  code *pcVar2;
  Func *polymorphicInlineCacheInfo;
  FunctionJITRuntimeInfo *runtimeInfo_00;
  bool bVar3;
  ExecutionMode EVar4;
  uint uVar5;
  uint uVar6;
  uint32 postCallByteCodeOffset;
  char16 *pcVar7;
  char16 *pcVar8;
  Opnd *pOVar9;
  undefined4 *puVar10;
  ProfiledInstr *pPVar11;
  JitArenaAllocator *pJVar12;
  JITTimeWorkItem *pJVar13;
  CodeGenWorkItemIDL *pCVar14;
  FunctionJITTimeInfo *pFVar15;
  JITTimeFunctionBody *pJVar16;
  intptr_t iVar17;
  Func *this_00;
  ThreadContextInfo *threadContextInfo;
  ScriptContextInfo *scriptContextInfo;
  JITOutput *this_01;
  JITOutputIDL *outputData;
  void *codeGenAllocators;
  ScriptContextProfiler *codeGenProfiler;
  Instr *pIVar18;
  Func *local_238;
  Instr *instrNext;
  TrackAllocData local_190;
  Func *local_168;
  Func *inlinee;
  JITTimePolymorphicInlineCacheInfo *entryPointPolymorphicInlineCacheInfo;
  FunctionJITRuntimeInfo *pFStack_150;
  ProfileId callApplyCallSiteId;
  FunctionJITRuntimeInfo *runtimeInfo;
  undefined8 local_140;
  TrackAllocData local_138;
  JITTimeWorkItem *local_110;
  JITTimeWorkItem *jitWorkItem;
  undefined8 local_100;
  TrackAllocData local_f8;
  CodeGenWorkItemIDL *local_d0;
  CodeGenWorkItemIDL *workItemData;
  ProfileId callSiteId;
  RegOpnd *pRStack_c0;
  RegSlot returnRegSlot;
  RegOpnd *returnValueOpnd;
  char16 debugStringBuffer [42];
  bool isCallback;
  bool isApplyTarget_local;
  bool safeThis_local;
  uint inlineCacheIndex_local;
  FunctionJITTimeInfo *inlineeData_local;
  StackSym *originalCallTargetStackSym_local;
  bool originalCallTargetOpndIsJITOpt_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  debugStringBuffer[0x29]._1_1_ = safeThis;
  debugStringBuffer[0x29]._0_1_ = isApplyTarget;
  debugStringBuffer[0x28]._1_1_ = inlineeDefInstr != (Instr *)0x0;
  if ((bool)debugStringBuffer[0x28]._1_1_) {
    uVar5 = Func::GetSourceContextId(this->topFunc);
    uVar6 = Func::GetLocalFunctionId(this->topFunc);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlineCallbacksPhase,uVar5,uVar6);
    if (!bVar3) {
      uVar5 = Func::GetSourceContextId(this->topFunc);
      uVar6 = Func::GetLocalFunctionId(this->topFunc);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCallbacksPhase,uVar5,uVar6);
      if (!bVar3) goto LAB_00720922;
    }
    pJVar16 = FunctionJITTimeInfo::GetBody(inlineeData);
    pcVar7 = JITTimeFunctionBody::GetDisplayName(pJVar16);
    pcVar8 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeData,(wchar (*) [42])&returnValueOpnd);
    Output::Print(L"INLINING CALLBACK : Inlining callback for call/apply target : \t%s (%s)\n",
                  pcVar7,pcVar8);
    Output::Flush();
  }
LAB_00720922:
  pOVar9 = IR::Instr::GetDst(callInstr);
  if (pOVar9 == (Opnd *)0x0) {
    pRStack_c0 = (RegOpnd *)0x0;
    workItemData._4_4_ = 0xffffffff;
  }
  else {
    pOVar9 = IR::Instr::UnlinkDst(callInstr);
    pRStack_c0 = IR::Opnd::AsRegOpnd(pOVar9);
    workItemData._4_4_ = StackSym::GetByteCodeRegSlot(pRStack_c0->m_sym);
  }
  bVar3 = IR::Instr::IsProfiledInstr(callInstr);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xc50,"(callInstr->IsProfiledInstr())","callInstr->IsProfiledInstr()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pPVar11 = IR::Instr::AsProfiledInstr(callInstr);
  workItemData._2_2_ = (pPVar11->u).field_3.fldInfoData.f1;
  pJVar12 = this->topFunc->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_f8,(type_info *)&CodeGenWorkItemIDL::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
             ,0xc54);
  pJVar12 = (JitArenaAllocator *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           pJVar12,&local_f8);
  jitWorkItem = (JITTimeWorkItem *)Memory::JitArenaAllocator::Alloc;
  local_100 = 0;
  local_d0 = (CodeGenWorkItemIDL *)new<Memory::JitArenaAllocator>(0x60,pJVar12,0x4e98c0);
  bVar3 = Func::IsJitInDebugMode(this->topFunc);
  local_d0->isJitInDebugMode = bVar3;
  local_d0->type = '\0';
  pJVar13 = Func::GetWorkItem(this->topFunc);
  EVar4 = JITTimeWorkItem::GetJitMode(pJVar13);
  local_d0->jitMode = EVar4;
  pJVar13 = Func::GetWorkItem(this->topFunc);
  pCVar14 = JITTimeWorkItem::GetWorkItemData(pJVar13);
  local_d0->nativeDataAddr = pCVar14->nativeDataAddr;
  local_d0->loopNumber = 0xffffffff;
  local_d0->jitData = &inlineeData->m_data;
  pJVar12 = this->topFunc->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_138,(type_info *)&JITTimeWorkItem::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
             ,0xc5d);
  pJVar12 = (JitArenaAllocator *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           pJVar12,&local_138);
  runtimeInfo = (FunctionJITRuntimeInfo *)Memory::JitArenaAllocator::Alloc;
  local_140 = 0;
  pJVar13 = (JITTimeWorkItem *)new<Memory::JitArenaAllocator>(0x1e0,pJVar12,0x4e98c0);
  JITTimeWorkItem::JITTimeWorkItem(pJVar13,local_d0);
  local_110 = pJVar13;
  if (targetType == LdFld) {
    pJVar13 = Func::GetWorkItem(callInstr->m_func);
    pFVar15 = JITTimeWorkItem::GetJITTimeInfo(pJVar13);
    pFStack_150 = FunctionJITTimeInfo::GetLdFldInlineeRuntimeData(pFVar15,inlineCacheIndex);
  }
  else if (targetType == Callback) {
    pJVar13 = Func::GetWorkItem(inlineeDefInstr->m_func);
    pFVar15 = JITTimeWorkItem::GetJITTimeInfo(pJVar13);
    pPVar11 = IR::Instr::AsProfiledInstr(inlineeDefInstr);
    TVar1 = (pPVar11->u).field_3.fldInfoData;
    pJVar16 = FunctionJITTimeInfo::GetBody(inlineeData);
    iVar17 = JITTimeFunctionBody::GetAddr(pJVar16);
    pFStack_150 = FunctionJITTimeInfo::GetInlineeForCallbackInlineeRuntimeData
                            (pFVar15,TVar1.f1,iVar17);
  }
  else if (targetType == Other) {
    pJVar16 = Func::GetJITFunctionBody(callInstr->m_func);
    entryPointPolymorphicInlineCacheInfo._6_2_ =
         JITTimeFunctionBody::GetCallApplyCallSiteIdForCallSiteId(pJVar16,workItemData._2_2_);
    pJVar13 = Func::GetWorkItem(callInstr->m_func);
    pFVar15 = JITTimeWorkItem::GetJITTimeInfo(pJVar13);
    pFStack_150 = FunctionJITTimeInfo::GetCallApplyTargetInlineeRuntimeData
                            (pFVar15,entryPointPolymorphicInlineCacheInfo._6_2_);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xc72,"((0))","UNREACHED");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  bVar3 = FunctionJITTimeInfo::HasBody(inlineeData);
  if (bVar3) {
    pJVar13 = Func::GetWorkItem(this->topFunc);
    pJVar16 = FunctionJITTimeInfo::GetBody(inlineeData);
    iVar17 = JITTimeFunctionBody::GetAddr(pJVar16);
    local_238 = (Func *)JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(pJVar13,iVar17);
  }
  else {
    local_238 = (Func *)0x0;
  }
  inlinee = local_238;
  pJVar12 = this->topFunc->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_190,(type_info *)&Func::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
             ,0xca0);
  pJVar12 = (JitArenaAllocator *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           pJVar12,&local_190);
  this_00 = (Func *)new<Memory::JitArenaAllocator>(0x420,pJVar12,0x4e98c0);
  pJVar13 = local_110;
  pJVar12 = this->topFunc->m_alloc;
  threadContextInfo = Func::GetThreadContextInfo(this->topFunc);
  scriptContextInfo = Func::GetScriptContextInfo(this->topFunc);
  this_01 = Func::GetJITOutput(this->topFunc);
  outputData = JITOutput::GetOutputData(this_01);
  runtimeInfo_00 = pFStack_150;
  polymorphicInlineCacheInfo = inlinee;
  codeGenAllocators = Func::GetCodeGenAllocators(this->topFunc);
  codeGenProfiler = Func::GetCodeGenProfiler(this->topFunc);
  bVar3 = Func::IsBackgroundJIT(this->topFunc);
  parentFunc = callInstr->m_func;
  postCallByteCodeOffset = IR::Instr::GetByteCodeOffset(callInstr->m_next);
  Func::Func(this_00,pJVar12,pJVar13,threadContextInfo,scriptContextInfo,outputData,
             (EntryPointInfo *)0x0,runtimeInfo_00,
             (JITTimePolymorphicInlineCacheInfo *)polymorphicInlineCacheInfo,codeGenAllocators,
             codeGenProfiler,bVar3,parentFunc,postCallByteCodeOffset,workItemData._4_4_,false,
             workItemData._2_2_,false);
  local_168 = this_00;
  pIVar18 = InlineFunctionCommon
                      (this,callInstr,originalCallTargetOpndIsJITOpt,originalCallTargetStackSym,
                       inlineeData,this_00,callInstr->m_next,pRStack_c0,funcObjCheckInsertInstr,
                       (StackSym *)0x0,recursiveInlineDepth,
                       (bool)(debugStringBuffer[0x29]._1_1_ & 1),
                       (bool)((byte)debugStringBuffer[0x29] & 1));
  return pIVar18;
}

Assistant:

IR::Instr *
Inline::InlineCallApplyTarget_Shared(
    IR::Instr *callInstr, 
    bool originalCallTargetOpndIsJITOpt, 
    StackSym* originalCallTargetStackSym, 
    const FunctionJITTimeInfo *const inlineeData,
    uint inlineCacheIndex, 
    bool safeThis,
    bool isApplyTarget, 
    CallApplyTargetSourceType targetType, 
    IR::Instr * inlineeDefInstr, 
    uint recursiveInlineDepth,
    IR::Instr * funcObjCheckInsertInstr)
{
    const bool isCallback = inlineeDefInstr != nullptr;

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (isCallback)
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        INLINE_CALLBACKS_TRACE(_u("INLINING CALLBACK : Inlining callback for call/apply target : \t%s (%s)\n"), inlineeData->GetBody()->GetDisplayName(),
            inlineeData->GetDebugNumberSet(debugStringBuffer));
    }
#endif

    // returnValueOpnd
    IR::RegOpnd * returnValueOpnd;
    Js::RegSlot returnRegSlot;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
        returnRegSlot = returnValueOpnd->m_sym->GetByteCodeRegSlot();
    }
    else
    {
        returnValueOpnd = nullptr;
        returnRegSlot = Js::Constants::NoRegister;
    }

    Assert(callInstr->IsProfiledInstr());
    Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);

    // inlinee
    CodeGenWorkItemIDL * workItemData = JitAnewStruct(this->topFunc->m_alloc, CodeGenWorkItemIDL);

    workItemData->isJitInDebugMode = this->topFunc->IsJitInDebugMode();
    workItemData->type = JsFunctionType;
    workItemData->jitMode = static_cast<char>(this->topFunc->GetWorkItem()->GetJitMode());
    workItemData->nativeDataAddr = this->topFunc->GetWorkItem()->GetWorkItemData()->nativeDataAddr;
    workItemData->loopNumber = Js::LoopHeader::NoLoop;

    workItemData->jitData = (FunctionJITTimeDataIDL*)(inlineeData);
    JITTimeWorkItem * jitWorkItem = JitAnew(this->topFunc->m_alloc, JITTimeWorkItem, workItemData);

    const FunctionJITRuntimeInfo * runtimeInfo;
    switch (targetType)
    {
    case CallApplyTargetSourceType::LdFld:
        runtimeInfo = callInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetLdFldInlineeRuntimeData(inlineCacheIndex);
        break;

    case CallApplyTargetSourceType::Callback:
        runtimeInfo = inlineeDefInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetInlineeForCallbackInlineeRuntimeData(static_cast<Js::ProfileId>(inlineeDefInstr->AsProfiledInstr()->u.profileId), inlineeData->GetBody()->GetAddr());
        break;

    case CallApplyTargetSourceType::Other:
    {
        Js::ProfileId callApplyCallSiteId = callInstr->m_func->GetJITFunctionBody()->GetCallApplyCallSiteIdForCallSiteId(callSiteId);
        runtimeInfo = callInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallApplyTargetInlineeRuntimeData(callApplyCallSiteId);
        break;
    }

    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
        break;
    }

    JITTimePolymorphicInlineCacheInfo * entryPointPolymorphicInlineCacheInfo = inlineeData->HasBody() ? this->topFunc->GetWorkItem()->GetInlineePolymorphicInlineCacheInfo(inlineeData->GetBody()->GetAddr()) : nullptr;
#if !FLOATVAR
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        runtimeInfo,
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetNumberAllocator(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        callInstr->m_func,
        callInstr->m_next->GetByteCodeOffset(),
        returnRegSlot,
        false,
        callSiteId,
        false);
#else
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        runtimeInfo,
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        callInstr->m_func,
        callInstr->m_next->GetByteCodeOffset(),
        returnRegSlot,
        false,
        callSiteId,
        false);
#endif

    // instrNext
    IR::Instr* instrNext = callInstr->m_next;

    return InlineFunctionCommon(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlinee, instrNext, returnValueOpnd, funcObjCheckInsertInstr, nullptr, recursiveInlineDepth, safeThis, isApplyTarget);
}